

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::debug_print(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
              *this,AST_Node *t,string *prepend)

{
  char *__s;
  AST_Node *t_00;
  pointer pcVar1;
  void *pvVar2;
  ostream *poVar3;
  size_t sVar4;
  undefined8 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 *local_40;
  long local_38;
  
  local_50 = this;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(prepend->_M_dataplus)._M_p,prepend->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  __s = *(char **)(&DAT_00238e00 + (long)(int)t->identifier * 8);
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(t->text)._M_dataplus._M_p,(t->text)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," : ",3);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(t->location).start.line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(t->location).start.column);
  local_48 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_48,1);
  (**t->_vptr_AST_Node)(&local_48,t);
  puVar5 = (undefined8 *)CONCAT71(uStack_47,local_48);
  if (puVar5 != local_40) {
    do {
      t_00 = (AST_Node *)*puVar5;
      pcVar1 = (prepend->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + prepend->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_70,"  ");
      debug_print(local_50,t_00,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_40);
  }
  pvVar2 = (void *)CONCAT71(uStack_47,local_48);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_38 - (long)pvVar2);
  }
  return;
}

Assistant:

void debug_print(const AST_Node &t, std::string prepend = "") const override {
        std::cout << prepend << "(" << ast_node_type_to_string(t.identifier) << ") " << t.text << " : " << t.start().line << ", "
                  << t.start().column << '\n';
        for (const auto &node : t.get_children()) {
          debug_print(node.get(), prepend + "  ");
        }
      }